

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O2

void portfwdmgr_config(PortFwdManager *mgr,Conf *conf)

{
  byte bVar1;
  LogContext *ctx;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Conf *pCVar6;
  undefined4 *puVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  PortFwdRecord *pPVar11;
  PortFwdRecord *pPVar12;
  ssh_rportfwd *psVar13;
  byte bVar14;
  int iVar15;
  char *pcVar16;
  char *pcVar17;
  byte bVar18;
  ssh_rportfwd **ppsVar19;
  char *pcVar20;
  bool bVar21;
  char *local_70;
  char *local_58;
  char *local_50;
  char *key;
  
  if (mgr->conf != (Conf *)0x0) {
    conf_free(mgr->conf);
  }
  pCVar6 = conf_copy(conf);
  mgr->conf = pCVar6;
  iVar15 = 0;
  while (puVar7 = (undefined4 *)index234(mgr->forwardings,iVar15), puVar7 != (undefined4 *)0x0) {
    *puVar7 = 0;
    iVar15 = iVar15 + 1;
  }
  pcVar8 = (char *)0x0;
LAB_00124bc0:
  pcVar8 = conf_get_str_strs(conf,0xb0,pcVar8,&key);
  if (pcVar8 != (char *)0x0) {
    bVar1 = *key;
    if ((bVar1 - 0x34 < 0xe) && ((0x2005U >> (bVar1 - 0x34 & 0x1f) & 1) != 0)) {
      pcVar20 = key + 1;
      bVar18 = key[1];
      bVar14 = bVar1;
    }
    else {
      bVar14 = 0x41;
      pcVar20 = key;
      bVar18 = bVar1;
    }
    if ((bVar18 == 0x52) || (bVar18 == 0x4c)) {
      pcVar20 = pcVar20 + 1;
    }
    else {
      bVar18 = 0x4c;
    }
    pcVar9 = host_strchr(pcVar20,0x3a);
    if (pcVar9 == (char *)0x0) {
      local_50 = (char *)0x0;
    }
    else {
      pcVar20 = dupprintf("%.*s",(ulong)(uint)((int)pcVar9 - (int)pcVar20),pcVar20);
      local_50 = host_strduptrim(pcVar20);
      safefree(pcVar20);
      pcVar20 = pcVar9 + 1;
    }
    uVar3 = atoi(pcVar20);
    uVar4 = uVar3;
    if ((uVar3 == 0) && (uVar4 = net_service_lookup(pcVar20), uVar4 == 0)) {
      logeventf(mgr->cl->logctx,"Service lookup failed for source port \"%s\"",pcVar20);
      uVar4 = 0;
    }
    if (((bVar18 == 0x4c) && (*pcVar8 == 'D')) && (pcVar8[1] == '\0')) {
      bVar21 = true;
      bVar18 = 0x44;
      uVar5 = 0xffffffff;
      pcVar8 = (char *)0x0;
      local_58 = (char *)0x0;
LAB_00124d6f:
      if (uVar4 != 0) {
        pPVar11 = (PortFwdRecord *)safemalloc(1,0x48,0);
        pPVar11->type = (uint)bVar18;
        pPVar11->saddr = local_50;
        pcVar9 = (char *)0x0;
        if (uVar3 == 0) {
          pcVar9 = dupstr(pcVar20);
        }
        pPVar11->sserv = pcVar9;
        pPVar11->sport = uVar4;
        pPVar11->daddr = local_58;
        if (bVar21) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = dupstr(pcVar8);
        }
        pPVar11->dserv = pcVar8;
        pPVar11->dport = uVar5;
        pPVar11->local = (PortListener *)0x0;
        pPVar11->remote = (ssh_rportfwd *)0x0;
        iVar15 = (uint)(bVar14 == 0x36) * 2;
        if (bVar14 == 0x34) {
          iVar15 = 1;
        }
        pPVar11->addressfamily = iVar15;
        pPVar12 = (PortFwdRecord *)add234(mgr->forwardings,pPVar11);
        if (pPVar12 == pPVar11) {
          pPVar11->status = CREATE;
          pcVar8 = key;
        }
        else {
          if (pPVar12->status == DESTROY) {
            pPVar12->status = KEEP;
          }
          pfr_free(pPVar11);
          pcVar8 = key;
        }
        goto LAB_00124bc0;
      }
    }
    else {
      sVar10 = host_strcspn(pcVar8,":");
      local_58 = dupprintf("%.*s",sVar10 & 0xffffffff,pcVar8);
      pcVar8 = pcVar8 + ((sVar10 + 1) - (ulong)(pcVar8[sVar10] == '\0'));
      uVar5 = atoi(pcVar8);
      if (uVar5 != 0) {
        bVar21 = true;
        goto LAB_00124d6f;
      }
      uVar5 = net_service_lookup(pcVar8);
      if (uVar5 != 0) {
        bVar21 = false;
        goto LAB_00124d6f;
      }
      logeventf(mgr->cl->logctx,"Service lookup failed for destination port \"%s\"",pcVar8);
    }
    safefree(local_50);
    safefree(local_58);
    pcVar8 = key;
    goto LAB_00124bc0;
  }
  iVar15 = 0;
  while (pPVar11 = (PortFwdRecord *)index234(mgr->forwardings,iVar15),
        pPVar11 != (PortFwdRecord *)0x0) {
    if (pPVar11->status == DESTROY) {
      pcVar8 = "dynamic";
      if (pPVar11->type == 0x52) {
        pcVar8 = "remote";
      }
      if (pPVar11->type == 0x4c) {
        pcVar8 = "local";
      }
      pcVar20 = pPVar11->saddr;
      bVar21 = pcVar20 == (char *)0x0;
      if (bVar21) {
        pcVar20 = anon_var_dwarf_331ec + 10;
      }
      pcVar9 = ":";
      if (bVar21) {
        pcVar9 = anon_var_dwarf_331ec + 10;
      }
      pcVar20 = dupprintf("%s port forwarding from %s%s%d",pcVar8,pcVar20,pcVar9,
                          (ulong)pPVar11->sport);
      pcVar8 = pcVar20;
      if (pPVar11->type != 0x44) {
        pcVar8 = dupprintf("%s to %s:%d",pcVar20,pPVar11->daddr,(ulong)pPVar11->dport);
        safefree(pcVar20);
      }
      logeventf(mgr->cl->logctx,"Cancelling %s",pcVar8);
      safefree(pcVar8);
      if (pPVar11->remote == (ssh_rportfwd *)0x0) {
        if (pPVar11->local != (PortListener *)0x0) {
          ppsVar19 = (ssh_rportfwd **)&pPVar11->local;
          pfl_terminate(pPVar11->local);
          goto LAB_00124f64;
        }
      }
      else {
        ppsVar19 = &pPVar11->remote;
        (*mgr->cl->vt->rportfwd_remove)(mgr->cl,pPVar11->remote);
LAB_00124f64:
        *ppsVar19 = (ssh_rportfwd *)0x0;
      }
      delpos234(mgr->forwardings,iVar15);
      pfr_free(pPVar11);
      iVar15 = iVar15 + -1;
    }
    iVar15 = iVar15 + 1;
  }
  iVar15 = 0;
  do {
    pPVar11 = (PortFwdRecord *)index234(mgr->forwardings,iVar15);
    if (pPVar11 == (PortFwdRecord *)0x0) {
      return;
    }
    if (pPVar11->status == CREATE) {
      pcVar8 = pPVar11->saddr;
      bVar21 = pcVar8 == (char *)0x0;
      if (bVar21) {
        pcVar8 = anon_var_dwarf_331ec + 10;
      }
      pcVar20 = ":";
      if (bVar21) {
        pcVar20 = anon_var_dwarf_331ec + 10;
      }
      pcVar9 = pPVar11->sserv;
      bVar21 = pcVar9 == (char *)0x0;
      if (bVar21) {
        pcVar9 = anon_var_dwarf_331ec + 10;
      }
      pcVar16 = "(";
      if (bVar21) {
        pcVar16 = anon_var_dwarf_331ec + 10;
      }
      pcVar17 = ")";
      if (bVar21) {
        pcVar17 = anon_var_dwarf_331ec + 10;
      }
      pcVar8 = dupprintf("%s%s%s%s%d%s",pcVar8,pcVar20,pcVar9,pcVar16,(ulong)pPVar11->sport,pcVar17)
      ;
      if (pPVar11->type == 0x44) {
        local_70 = (char *)0x0;
LAB_0012510c:
        pcVar20 = pfl_listen((char *)0x0,-1,pPVar11->saddr,pPVar11->sport,mgr->cl,conf,
                             &pPVar11->local,pPVar11->addressfamily);
        pcVar9 = anon_var_dwarf_331ec + 10;
        if (pPVar11->addressfamily == 2) {
          pcVar9 = "IPv6 ";
        }
        if (pPVar11->addressfamily == 1) {
          pcVar9 = "IPv4 ";
        }
        pcVar16 = " failed: ";
        if (pcVar20 == (char *)0x0) {
          pcVar16 = anon_var_dwarf_331ec + 10;
        }
        pcVar17 = pcVar20;
        if (pcVar20 == (char *)0x0) {
          pcVar17 = anon_var_dwarf_331ec + 10;
        }
        logeventf(mgr->cl->logctx,"Local %sport %s SOCKS dynamic forwarding%s%s",pcVar9,pcVar8,
                  pcVar16,pcVar17);
        if (pcVar20 != (char *)0x0) {
          safefree(pcVar20);
        }
      }
      else {
        pcVar20 = pPVar11->dserv;
        bVar21 = pcVar20 == (char *)0x0;
        if (bVar21) {
          pcVar20 = anon_var_dwarf_331ec + 10;
        }
        pcVar9 = "(";
        if (bVar21) {
          pcVar9 = anon_var_dwarf_331ec + 10;
        }
        pcVar16 = ")";
        if (bVar21) {
          pcVar16 = anon_var_dwarf_331ec + 10;
        }
        local_70 = dupprintf("%s:%s%s%d%s",pPVar11->daddr,pcVar20,pcVar9,(ulong)pPVar11->dport,
                             pcVar16);
        if (pPVar11->type == 0x44) goto LAB_0012510c;
        if (pPVar11->type == 0x4c) {
          pcVar20 = pfl_listen(pPVar11->daddr,pPVar11->dport,pPVar11->saddr,pPVar11->sport,mgr->cl,
                               conf,&pPVar11->local,pPVar11->addressfamily);
          pcVar9 = anon_var_dwarf_331ec + 10;
          if (pPVar11->addressfamily == 2) {
            pcVar9 = "IPv6 ";
          }
          if (pPVar11->addressfamily == 1) {
            pcVar9 = "IPv4 ";
          }
          pcVar16 = " failed: ";
          if (pcVar20 == (char *)0x0) {
            pcVar16 = anon_var_dwarf_331ec + 10;
          }
          pcVar17 = pcVar20;
          if (pcVar20 == (char *)0x0) {
            pcVar17 = anon_var_dwarf_331ec + 10;
          }
          logeventf(mgr->cl->logctx,"Local %sport %s forwarding to %s%s%s",pcVar9,pcVar8,local_70,
                    pcVar16,pcVar17);
          if (pcVar20 != (char *)0x0) {
            safefree(pcVar20);
          }
        }
        else {
          pcVar20 = pPVar11->saddr;
          if (pcVar20 == (char *)0x0) {
            _Var2 = conf_get_bool(conf,0xaf);
            pcVar20 = "localhost";
            if (_Var2) {
              pcVar20 = anon_var_dwarf_331ec + 10;
            }
          }
          psVar13 = (*mgr->cl->vt->rportfwd_alloc)
                              (mgr->cl,pcVar20,pPVar11->sport,pPVar11->daddr,pPVar11->dport,
                               pPVar11->addressfamily,pcVar8,pPVar11,(ssh_sharing_connstate *)0x0);
          pPVar11->remote = psVar13;
          ctx = mgr->cl->logctx;
          if (psVar13 == (ssh_rportfwd *)0x0) {
            logeventf(ctx,"Duplicate remote port forwarding to %s:%d",pPVar11->daddr,
                      (ulong)pPVar11->dport);
            pfr_free(pPVar11);
          }
          else {
            logeventf(ctx,"Requesting remote port %s forward to %s",pcVar8,local_70);
          }
        }
      }
      safefree(pcVar8);
      safefree(local_70);
    }
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

void portfwdmgr_config(PortFwdManager *mgr, Conf *conf)
{
    PortFwdRecord *pfr;
    int i;
    char *key, *val;

    if (mgr->conf)
        conf_free(mgr->conf);
    mgr->conf = conf_copy(conf);

    /*
     * Go through the existing port forwardings and tag them
     * with status==DESTROY. Any that we want to keep will be
     * re-enabled (status==KEEP) as we go through the
     * configuration and find out which bits are the same as
     * they were before.
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++)
        pfr->status = DESTROY;

    for (val = conf_get_str_strs(conf, CONF_portfwd, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, CONF_portfwd, key, &key)) {
        char *kp, *kp2, *vp, *vp2;
        char address_family, type;
        int sport, dport, sserv, dserv;
        char *sports, *dports, *saddr, *host;

        kp = key;

        address_family = 'A';
        type = 'L';
        if (*kp == 'A' || *kp == '4' || *kp == '6')
            address_family = *kp++;
        if (*kp == 'L' || *kp == 'R')
            type = *kp++;

        if ((kp2 = host_strchr(kp, ':')) != NULL) {
            /*
             * There's a colon in the middle of the source port
             * string, which means that the part before it is
             * actually a source address.
             */
            char *saddr_tmp = dupprintf("%.*s", (int)(kp2 - kp), kp);
            saddr = host_strduptrim(saddr_tmp);
            sfree(saddr_tmp);
            sports = kp2+1;
        } else {
            saddr = NULL;
            sports = kp;
        }
        sport = atoi(sports);
        sserv = 0;
        if (sport == 0) {
            sserv = 1;
            sport = net_service_lookup(sports);
            if (!sport) {
                logeventf(mgr->cl->logctx, "Service lookup failed for source"
                          " port \"%s\"", sports);
            }
        }

        if (type == 'L' && !strcmp(val, "D")) {
            /* dynamic forwarding */
            host = NULL;
            dports = NULL;
            dport = -1;
            dserv = 0;
            type = 'D';
        } else {
            /* ordinary forwarding */
            vp = val;
            vp2 = vp + host_strcspn(vp, ":");
            host = dupprintf("%.*s", (int)(vp2 - vp), vp);
            if (*vp2)
                vp2++;
            dports = vp2;
            dport = atoi(dports);
            dserv = 0;
            if (dport == 0) {
                dserv = 1;
                dport = net_service_lookup(dports);
                if (!dport) {
                    logeventf(mgr->cl->logctx,
                              "Service lookup failed for destination"
                              " port \"%s\"", dports);
                }
            }
        }

        if (sport && dport) {
            /* Set up a description of the source port. */
            pfr = snew(PortFwdRecord);
            pfr->type = type;
            pfr->saddr = saddr;
            pfr->sserv = sserv ? dupstr(sports) : NULL;
            pfr->sport = sport;
            pfr->daddr = host;
            pfr->dserv = dserv ? dupstr(dports) : NULL;
            pfr->dport = dport;
            pfr->local = NULL;
            pfr->remote = NULL;
            pfr->addressfamily = (address_family == '4' ? ADDRTYPE_IPV4 :
                                  address_family == '6' ? ADDRTYPE_IPV6 :
                                  ADDRTYPE_UNSPEC);

            PortFwdRecord *existing = add234(mgr->forwardings, pfr);
            if (existing != pfr) {
                if (existing->status == DESTROY) {
                    /*
                     * We already have a port forwarding up and running
                     * with precisely these parameters. Hence, no need
                     * to do anything; simply re-tag the existing one
                     * as KEEP.
                     */
                    existing->status = KEEP;
                }
                /*
                 * Anything else indicates that there was a duplicate
                 * in our input, which we'll silently ignore.
                 */
                pfr_free(pfr);
            } else {
                pfr->status = CREATE;
            }
        } else {
            sfree(saddr);
            sfree(host);
        }
    }

    /*
     * Now go through and destroy any port forwardings which were
     * not re-enabled.
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++) {
        if (pfr->status == DESTROY) {
            char *message;

            message = dupprintf("%s port forwarding from %s%s%d",
                                pfr->type == 'L' ? "local" :
                                pfr->type == 'R' ? "remote" : "dynamic",
                                pfr->saddr ? pfr->saddr : "",
                                pfr->saddr ? ":" : "",
                                pfr->sport);

            if (pfr->type != 'D') {
                char *msg2 = dupprintf("%s to %s:%d", message,
                                       pfr->daddr, pfr->dport);
                sfree(message);
                message = msg2;
            }

            logeventf(mgr->cl->logctx, "Cancelling %s", message);
            sfree(message);

            /* pfr->remote or pfr->local may be NULL if setting up a
             * forwarding failed. */
            if (pfr->remote) {
                /*
                 * Cancel the port forwarding at the server
                 * end.
                 *
                 * Actually closing the listening port on the server
                 * side may fail - because in SSH-1 there's no message
                 * in the protocol to request it!
                 *
                 * Instead, we simply remove the record of the
                 * forwarding from our local end, so that any
                 * connections the server tries to make on it are
                 * rejected.
                 */
                ssh_rportfwd_remove(mgr->cl, pfr->remote);
                pfr->remote = NULL;
            } else if (pfr->local) {
                pfl_terminate(pfr->local);
                pfr->local = NULL;
            }

            delpos234(mgr->forwardings, i);
            pfr_free(pfr);
            i--;                       /* so we don't skip one in the list */
        }
    }

    /*
     * And finally, set up any new port forwardings (status==CREATE).
     */
    for (i = 0; (pfr = index234(mgr->forwardings, i)) != NULL; i++) {
        if (pfr->status == CREATE) {
            char *sportdesc, *dportdesc;
            sportdesc = dupprintf("%s%s%s%s%d%s",
                                  pfr->saddr ? pfr->saddr : "",
                                  pfr->saddr ? ":" : "",
                                  pfr->sserv ? pfr->sserv : "",
                                  pfr->sserv ? "(" : "",
                                  pfr->sport,
                                  pfr->sserv ? ")" : "");
            if (pfr->type == 'D') {
                dportdesc = NULL;
            } else {
                dportdesc = dupprintf("%s:%s%s%d%s",
                                      pfr->daddr,
                                      pfr->dserv ? pfr->dserv : "",
                                      pfr->dserv ? "(" : "",
                                      pfr->dport,
                                      pfr->dserv ? ")" : "");
            }

            if (pfr->type == 'L') {
                char *err = pfl_listen(pfr->daddr, pfr->dport,
                                       pfr->saddr, pfr->sport,
                                       mgr->cl, conf, &pfr->local,
                                       pfr->addressfamily);

                logeventf(mgr->cl->logctx,
                          "Local %sport %s forwarding to %s%s%s",
                          pfr->addressfamily == ADDRTYPE_IPV4 ? "IPv4 " :
                          pfr->addressfamily == ADDRTYPE_IPV6 ? "IPv6 " : "",
                          sportdesc, dportdesc,
                          err ? " failed: " : "", err ? err : "");
                if (err)
                    sfree(err);
            } else if (pfr->type == 'D') {
                char *err = pfl_listen(NULL, -1, pfr->saddr, pfr->sport,
                                       mgr->cl, conf, &pfr->local,
                                       pfr->addressfamily);

                logeventf(mgr->cl->logctx,
                          "Local %sport %s SOCKS dynamic forwarding%s%s",
                          pfr->addressfamily == ADDRTYPE_IPV4 ? "IPv4 " :
                          pfr->addressfamily == ADDRTYPE_IPV6 ? "IPv6 " : "",
                          sportdesc,
                          err ? " failed: " : "", err ? err : "");

                if (err)
                    sfree(err);
            } else {
                const char *shost;

                if (pfr->saddr) {
                    shost = pfr->saddr;
                } else if (conf_get_bool(conf, CONF_rport_acceptall)) {
                    shost = "";
                } else {
                    shost = "localhost";
                }

                pfr->remote = ssh_rportfwd_alloc(
                    mgr->cl, shost, pfr->sport, pfr->daddr, pfr->dport,
                    pfr->addressfamily, sportdesc, pfr, NULL);

                if (!pfr->remote) {
                    logeventf(mgr->cl->logctx,
                              "Duplicate remote port forwarding to %s:%d",
                              pfr->daddr, pfr->dport);
                    pfr_free(pfr);
                } else {
                    logeventf(mgr->cl->logctx, "Requesting remote port %s"
                              " forward to %s", sportdesc, dportdesc);
                }
            }
            sfree(sportdesc);
            sfree(dportdesc);
        }
    }
}